

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.cpp
# Opt level: O1

void de::anon_unknown_1::runAppendListTest
               (deUint32 numThreads,deUint32 numElements,deUint32 numElementsHint)

{
  int *piVar1;
  deUint32 dVar2;
  long *plVar3;
  void *pvVar4;
  Thread *this;
  long *plVar5;
  ulong uVar6;
  Block *delBlock;
  long lVar7;
  ulong uVar8;
  long lVar9;
  deThreadPriority dVar10;
  pointer pSVar11;
  ulong uVar12;
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  threads;
  vector<unsigned_int,_std::allocator<unsigned_int>_> countByThread;
  SharedState sharedState;
  allocator_type local_b1;
  deUint32 local_b0;
  deUint32 local_ac;
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  ulong local_70;
  deUint32 local_68;
  SpinBarrier local_64;
  ulong local_50;
  ulong local_48;
  long *local_40;
  long *local_38;
  
  uVar12 = (ulong)numElements;
  local_68 = numElements;
  SpinBarrier::SpinBarrier(&local_64,numThreads);
  local_48 = 0;
  local_50 = (ulong)numElementsHint;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = 0;
  pvVar4 = deAlignedMalloc((ulong)numElementsHint << 3,8);
  plVar3[1] = (long)pvVar4;
  plVar3[2] = 0;
  uVar8 = (ulong)numThreads;
  local_a8.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = plVar3;
  local_38 = plVar3;
  local_a8.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(uVar8 * 0x10);
  pSVar11 = local_a8.
            super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar8;
  local_b0 = numElements;
  local_a8.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar11;
  local_70 = uVar8;
  if (numThreads != 0) {
    memset(local_a8.
           super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
           ._M_impl.super__Vector_impl_data._M_start,0,uVar8 * 0x10);
    lVar9 = uVar8 << 4;
    dVar10 = DE_THREADPRIORITY_LOWEST;
    lVar7 = 0;
    local_ac = numThreads;
    local_a8.
    super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
    do {
      this = (Thread *)operator_new(0x28);
      Thread::Thread(this);
      this->_vptr_Thread = (_func_int **)&PTR__Thread_00277a58;
      this[1]._vptr_Thread = (_func_int **)&local_68;
      this[1].m_attribs.priority = dVar10;
      plVar5 = (long *)operator_new(0x20);
      pSVar11 = local_a8.
                super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar5 + 1) = 0;
      *(undefined4 *)((long)plVar5 + 0xc) = 0;
      *plVar5 = (long)&PTR__SharedPtrState_00277a98;
      plVar5[2] = (long)this;
      *(undefined4 *)(plVar5 + 1) = 1;
      *(undefined4 *)((long)plVar5 + 0xc) = 1;
      plVar3 = *(long **)((long)&(local_a8.
                                  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar7);
      if (plVar3 != plVar5) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)
             ((long)&(local_a8.
                      super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7) = 0;
            (**(code **)(**(long **)((long)&(local_a8.
                                             super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                    lVar7) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar11->m_state + lVar7) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)&pSVar11->m_state + lVar7);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)&pSVar11->m_state + lVar7) = 0;
          }
        }
        *(Thread **)((long)&pSVar11->m_ptr + lVar7) = this;
        *(long **)((long)&pSVar11->m_state + lVar7) = plVar5;
        LOCK();
        *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar11->m_state + lVar7) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar5 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar5 + 0x10))(plVar5);
      }
      LOCK();
      piVar1 = (int *)((long)plVar5 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar5 + 8))(plVar5);
      }
      Thread::start(*(Thread **)
                     ((long)&(local_a8.
                              super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7));
      uVar8 = local_70;
      pSVar11 = local_a8.
                super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      numThreads = local_ac;
      lVar7 = lVar7 + 0x10;
      dVar10 = dVar10 + DE_THREADPRIORITY_LOW;
    } while (lVar9 != lVar7);
    lVar7 = local_70 << 4;
    lVar9 = 0;
    uVar12 = (ulong)local_b0;
    do {
      Thread::join(*(Thread **)((long)&pSVar11->m_ptr + lVar9));
      lVar9 = lVar9 + 0x10;
    } while (lVar7 != lVar9);
  }
  if (local_48 != uVar12 * uVar8) {
    deAssertFail("sharedState.testList.size() == (size_t)numElements*(size_t)numThreads",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                 ,0x6f);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,uVar8,&local_b1);
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    memset(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           ((long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-4 - (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
  }
  uVar12 = local_50;
  if ((local_40 != local_38) || (local_48 % local_50 != 0)) {
    uVar8 = 0;
    plVar3 = local_40;
    do {
      lVar7 = plVar3[1];
      if (numThreads <= *(uint *)(lVar7 + uVar8 * 8)) {
        deAssertFail("de::inBounds(elem.threadNdx, 0u, numThreads)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x7c);
      }
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[*(uint *)(lVar7 + uVar8 * 8)] !=
          *(uint *)(lVar7 + 4 + uVar8 * 8)) {
        deAssertFail("countByThread[elem.threadNdx] == elem.elemNdx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x7d);
      }
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[*(uint *)(lVar7 + uVar8 * 8)] =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[*(uint *)(lVar7 + uVar8 * 8)] + 1;
      uVar8 = uVar8 + 1;
      if (uVar8 == uVar12) {
        plVar3 = (long *)plVar3[2];
        uVar8 = 0;
      }
    } while ((plVar3 != local_38) || (uVar8 != local_48 % local_50));
  }
  uVar12 = local_70;
  dVar2 = local_b0;
  if (numThreads != 0) {
    uVar8 = 0;
    do {
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] != dVar2) {
        deAssertFail("countByThread[threadNdx] == numElements",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x83);
      }
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ::~vector(&local_a8);
  if (local_40 != (long *)0x0) {
    uVar12 = 0;
    plVar3 = local_40;
    do {
      plVar5 = (long *)plVar3[2];
      uVar8 = (*plVar3 + 1) * local_50;
      uVar12 = uVar12 - 1;
      do {
        uVar6 = local_48;
        if (uVar8 <= local_48) {
          uVar6 = uVar8;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar6);
      deAlignedFree((void *)plVar3[1]);
      operator_delete(plVar3,0x18);
      plVar3 = plVar5;
    } while (plVar5 != (long *)0x0);
  }
  SpinBarrier::~SpinBarrier(&local_64);
  return;
}

Assistant:

void runAppendListTest (deUint32 numThreads, deUint32 numElements, deUint32 numElementsHint)
{
	SharedState				sharedState		(numThreads, numElements, numElementsHint);
	vector<TestThreadSp>	threads			(numThreads);

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
	{
		threads[threadNdx] = TestThreadSp(new TestThread(&sharedState, threadNdx));
		threads[threadNdx]->start();
	}

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
		threads[threadNdx]->join();

	DE_TEST_ASSERT(sharedState.testList.size() == (size_t)numElements*(size_t)numThreads);

	{
		vector<deUint32>	countByThread	(numThreads);

		std::fill(countByThread.begin(), countByThread.end(), 0);

		for (AppendList<TestElem>::const_iterator elemIter = sharedState.testList.begin();
			 elemIter != sharedState.testList.end();
			 ++elemIter)
		{
			const TestElem&	elem	= *elemIter;

			DE_TEST_ASSERT(de::inBounds(elem.threadNdx, 0u, numThreads));
			DE_TEST_ASSERT(countByThread[elem.threadNdx] == elem.elemNdx);

			countByThread[elem.threadNdx] += 1;
		}

		for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
			DE_TEST_ASSERT(countByThread[threadNdx] == numElements);
	}
}